

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall
CMU462::DynamicScene::Scene::getHoveredObject
          (Scene *this,Vector2D *p,bool getElement,bool transformed)

{
  bool bVar1;
  uint uVar2;
  reference ppSVar3;
  SceneObject *o_1;
  iterator __end2_1;
  iterator __begin2_1;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2_1;
  int i;
  int ID;
  uchar color [4];
  SceneObject *o;
  iterator __end2;
  iterator __begin2;
  set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
  *__range2;
  int pickID;
  bool transformed_local;
  bool getElement_local;
  Vector2D *p_local;
  Scene *this_local;
  
  __range2._6_1_ = transformed;
  __range2._7_1_ = getElement;
  _pickID = p;
  p_local = (Vector2D *)this;
  glClearColor(0x3f800000,0x3f800000,0x3f800000);
  glClear(0x4100);
  glPushAttrib(0xfffff);
  glDisable(0xb50);
  glDisable(0xbe2);
  __range2._0_4_ = 0;
  __end2 = std::
           set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
           ::begin(&this->objects);
  o = (SceneObject *)
      std::
      set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
      ::end(&this->objects);
  while( true ) {
    bVar1 = std::operator!=(&__end2,(_Self *)&o);
    if (!bVar1) break;
    ppSVar3 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*(&__end2);
    _ID = *ppSVar3;
    if ((_ID->isPickable & 1U) != 0) {
      (*_ID->_vptr_SceneObject[9])(_ID,&__range2,(ulong)__range2._6_1_ & 1);
    }
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(&__end2);
  }
  glReadPixels((int)_pickID->x,(int)_pickID->y,1,1,0x1908,0x1401,&i);
  uVar2 = RGBToIndex((uchar)i,i._1_1_,i._2_1_);
  Selection::clear(&this->hovered);
  __end2_1 = std::
             set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
             ::begin(&this->objects);
  o_1 = (SceneObject *)
        std::
        set<CMU462::DynamicScene::SceneObject_*,_std::less<CMU462::DynamicScene::SceneObject_*>,_std::allocator<CMU462::DynamicScene::SceneObject_*>_>
        ::end(&this->objects);
  while( true ) {
    bVar1 = std::operator!=(&__end2_1,(_Self *)&o_1);
    if (!bVar1) break;
    ppSVar3 = std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator*
                        (&__end2_1);
    (*(*ppSVar3)->_vptr_SceneObject[10])(*ppSVar3,(ulong)uVar2,this);
    std::_Rb_tree_const_iterator<CMU462::DynamicScene::SceneObject_*>::operator++(&__end2_1);
  }
  if ((__range2._7_1_ & 1) == 0) {
    (this->hovered).element = (HalfedgeElement *)0x0;
  }
  glPopAttrib();
  return;
}

Assistant:

void Scene::getHoveredObject( const Vector2D& p, bool getElement, bool transformed)
{
   // Set the background color to the maximum possible value---this value should be far
   // beyond the maximum pick index, since we have at most 2^(8+8+8) = 16,777,216 distinct IDs
   glClearColor( 1., 1., 1., 1. );

   // Clear any color values currently in the color buffer---we do not want to use these for
   // picking, since they represent, e.g., shading colors rather than pick IDs.  Also clear
   // the depth buffer so that we can use it to determine the closest object under the cursor.
   glClear( GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT );

   // We want to draw the pick IDs as raw color values; shading functionality
   // like lighting and blending shouldn't interfere.
   glPushAttrib( GL_ALL_ATTRIB_BITS );
   glDisable( GL_LIGHTING );
   glDisable( GL_BLEND );

   // Keep track of the number of picking IDs used so far
   int pickID = 0;

   for( auto o : objects )
   {
      if( o->isPickable )
      {
         // The implementation of draw_pick MUST increment the
         // pickID for each new pickable element it draws.
         o->draw_pick( pickID, transformed );
      }
   }

   unsigned char color[4];
   glReadPixels( p.x, p.y, 1, 1, GL_RGBA, GL_UNSIGNED_BYTE, color );

   int ID = RGBToIndex( color[0], color[1], color[2] );

   // By default, set hovered object to "none"
   hovered.clear();

   // Determine which element generated this pick ID
   int i = 0;
   for( auto o : objects )
   {
      // Call the object's method for setting the selection
      // based on the ID.  (This allows the object to set
      // the selection to an element within that particular
      // object type, e.g., for a mesh it can specify that a
      // particular vertex is selected, or for a camera it might
      // specify that a control handle was selected, etc.)
      o->setSelection( ID, hovered );

      i++;
   }
   
   if (!getElement)
   {
     // Discard element information
     hovered.element = NULL;
   }

   // Restore any draw state that we disabled above.
   glPopAttrib();
}